

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O2

void __thiscall
GIM_BOX_TREE::build_tree(GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes)

{
  GIM_BOX_TREE_NODE local_40;
  
  *(undefined4 *)this = 0;
  local_40.m_left = 0;
  local_40.m_right = 0;
  local_40.m_escapeIndex = 0;
  local_40.m_data = 0;
  gim_array<GIM_BOX_TREE_NODE>::resize
            ((gim_array<GIM_BOX_TREE_NODE> *)(this + 8),*(int *)(primitive_boxes + 8) * 2,true,
             &local_40);
  _build_sub_tree(this,primitive_boxes,0,*(uint *)(primitive_boxes + 8));
  return;
}

Assistant:

void GIM_BOX_TREE::build_tree(
	gim_array<GIM_AABB_DATA>& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}